

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_wfopen(FILE **ppFile,wchar_t *pFilePath,wchar_t *pOpenMode,
                   ma_allocation_callbacks *pAllocationCallbacks)

{
  int *piVar1;
  FILE *pFVar2;
  long in_RDX;
  wchar_t *in_RSI;
  long *in_RDI;
  size_t i;
  char pOpenModeMB [32];
  char *pFilePathMB;
  wchar_t *pFilePathTemp;
  size_t lenMB;
  mbstate_t mbs;
  ma_allocation_callbacks *in_stack_ffffffffffffff68;
  void *p;
  char local_88 [32];
  char *local_68;
  wchar_t *local_60;
  size_t local_58;
  mbstate_t local_50 [2];
  long local_40;
  wchar_t *local_38;
  long *local_30;
  ma_result local_24;
  undefined8 local_20;
  mbstate_t *local_18;
  undefined8 local_10;
  mbstate_t *local_8;
  
  if (in_RDI != (long *)0x0) {
    *in_RDI = 0;
  }
  if (((in_RSI == (wchar_t *)0x0) || (in_RDX == 0)) || (in_RDI == (long *)0x0)) {
    local_24 = MA_INVALID_ARGS;
  }
  else {
    local_68 = (char *)0x0;
    local_40 = in_RDX;
    local_38 = in_RSI;
    local_30 = in_RDI;
    memset(local_88,0,0x20);
    local_8 = local_50;
    local_10 = 8;
    if (local_8 != (mbstate_t *)0x0) {
      memset(local_8,0,8);
    }
    local_58 = wcsrtombs((char *)0x0,&local_60,0,local_50);
    if (local_58 == 0xffffffffffffffff) {
      piVar1 = __errno_location();
      local_24 = ma_result_from_errno(*piVar1);
    }
    else {
      local_68 = (char *)ma_malloc((size_t)in_stack_ffffffffffffff68,
                                   (ma_allocation_callbacks *)0x1abb5b);
      if (local_68 == (char *)0x0) {
        local_24 = MA_OUT_OF_MEMORY;
      }
      else {
        local_60 = local_38;
        local_18 = local_50;
        local_20 = 8;
        if (local_18 != (mbstate_t *)0x0) {
          memset(local_18,0,8);
        }
        wcsrtombs(local_68,&local_60,local_58 + 1,local_50);
        for (p = (void *)0x0; *(int *)(local_40 + (long)p * 4) != 0; p = (void *)((long)p + 1)) {
          local_88[(long)p] = (char)*(undefined4 *)(local_40 + (long)p * 4);
        }
        local_88[(long)p] = '\0';
        pFVar2 = fopen(local_68,local_88);
        *local_30 = (long)pFVar2;
        ma_free(p,in_stack_ffffffffffffff68);
        if (*local_30 == 0) {
          local_24 = MA_ERROR;
        }
        else {
          local_24 = MA_SUCCESS;
        }
      }
    }
  }
  return local_24;
}

Assistant:

MA_API ma_result ma_wfopen(FILE** ppFile, const wchar_t* pFilePath, const wchar_t* pOpenMode, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (ppFile != NULL) {
        *ppFile = NULL;  /* Safety. */
    }

    if (pFilePath == NULL || pOpenMode == NULL || ppFile == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_HAS_WFOPEN)
    {
        /* Use _wfopen() on Windows. */
    #if defined(_MSC_VER) && _MSC_VER >= 1400
        errno_t err = _wfopen_s(ppFile, pFilePath, pOpenMode);
        if (err != 0) {
            return ma_result_from_errno(err);
        }
    #else
        *ppFile = _wfopen(pFilePath, pOpenMode);
        if (*ppFile == NULL) {
            return ma_result_from_errno(errno);
        }
    #endif
        (void)pAllocationCallbacks;
    }
#else
    /*
    Use fopen() on anything other than Windows. Requires a conversion. This is annoying because fopen() is locale specific. The only real way I can
    think of to do this is with wcsrtombs(). Note that wcstombs() is apparently not thread-safe because it uses a static global mbstate_t object for
    maintaining state. I've checked this with -std=c89 and it works, but if somebody get's a compiler error I'll look into improving compatibility.
    */
    {
        mbstate_t mbs;
        size_t lenMB;
        const wchar_t* pFilePathTemp = pFilePath;
        char* pFilePathMB = NULL;
        char pOpenModeMB[32] = {0};

        /* Get the length first. */
        MA_ZERO_OBJECT(&mbs);
        lenMB = wcsrtombs(NULL, &pFilePathTemp, 0, &mbs);
        if (lenMB == (size_t)-1) {
            return ma_result_from_errno(errno);
        }

        pFilePathMB = (char*)ma_malloc(lenMB + 1, pAllocationCallbacks);
        if (pFilePathMB == NULL) {
            return MA_OUT_OF_MEMORY;
        }

        pFilePathTemp = pFilePath;
        MA_ZERO_OBJECT(&mbs);
        wcsrtombs(pFilePathMB, &pFilePathTemp, lenMB + 1, &mbs);

        /* The open mode should always consist of ASCII characters so we should be able to do a trivial conversion. */
        {
            size_t i = 0;
            for (;;) {
                if (pOpenMode[i] == 0) {
                    pOpenModeMB[i] = '\0';
                    break;
                }

                pOpenModeMB[i] = (char)pOpenMode[i];
                i += 1;
            }
        }

        *ppFile = fopen(pFilePathMB, pOpenModeMB);

        ma_free(pFilePathMB, pAllocationCallbacks);
    }

    if (*ppFile == NULL) {
        return MA_ERROR;
    }
#endif

    return MA_SUCCESS;
}